

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundingBoxHelpers.cpp
# Opt level: O2

void __thiscall
iDynTree::BoundingBoxProjectionConstraint::setProjectionAlongDirection
          (BoundingBoxProjectionConstraint *this,Vector3 direction)

{
  Matrix2x3 *pMVar1;
  undefined8 *local_b8 [2];
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  double local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  double local_78;
  undefined1 local_68 [32];
  variable_if_dynamic<long,__1> local_48;
  variable_if_dynamic<long,__1> vStack_40;
  Index local_38;
  
  local_b8[0] = &local_88;
  local_88 = 0x3ff0000000000000;
  uStack_80 = 0;
  local_78 = -direction.m_data[0] / direction.m_data[2];
  local_a8 = 0;
  uStack_a4 = 0;
  uStack_a0 = 0;
  uStack_9c = 0x3ff00000;
  local_98 = -direction.m_data[1] / direction.m_data[2];
  pMVar1 = &this->Pdirection;
  local_48.m_value = 0;
  vStack_40.m_value = 0;
  local_38 = 3;
  local_68._0_8_ = pMVar1;
  local_68._16_8_ = pMVar1;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,2,3,1,2,3>,0,Eigen::Stride<0,0>>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_false>
              *)local_68,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_b8);
  local_68._0_8_ = &this->field_0xb0;
  local_48.m_value = 1;
  vStack_40.m_value = 0;
  local_38 = 3;
  local_b8[0] = (undefined8 *)&local_a8;
  local_68._16_8_ = pMVar1;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,2,3,1,2,3>,0,Eigen::Stride<0,0>>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_false>
              *)local_68,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_b8);
  return;
}

Assistant:

void BoundingBoxProjectionConstraint::setProjectionAlongDirection(Vector3 direction)
    {
        Vector3 xProjection, yProjection;

        // define the projection for the x-component
        xProjection.setVal(0, 1.0);
        xProjection.setVal(1, 0.0);
        xProjection.setVal(2, -direction.getVal(0) / direction.getVal(2));

        // define the projection for the y-component
        yProjection.setVal(0, 0.0);
        yProjection.setVal(1, 1.0);
        yProjection.setVal(2, -direction.getVal(1) / direction.getVal(2));

        // fill the projection matrix
        toEigen(Pdirection).block<1, 3>(0,0) = toEigen(xProjection);
        toEigen(Pdirection).block<1, 3>(1,0) = toEigen(yProjection);

    }